

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextGLImpl::DrawIndexed(DeviceContextGLImpl *this,DrawIndexedAttribs *Attribs)

{
  size_t local_28;
  size_t FirstIndexByteOffset;
  GLenum GLIndexType;
  GLenum GlTopology;
  DrawIndexedAttribs *Attribs_local;
  DeviceContextGLImpl *this_local;
  
  _GLIndexType = Attribs;
  Attribs_local = (DrawIndexedAttribs *)this;
  DeviceContextBase<Diligent::EngineGLImplTraits>::DrawIndexed
            (&this->super_DeviceContextBase<Diligent::EngineGLImplTraits>,Attribs,0);
  PrepareForDraw(this,_GLIndexType->Flags,true,(GLenum *)((long)&FirstIndexByteOffset + 4));
  PrepareForIndexedDraw
            (this,_GLIndexType->IndexType,_GLIndexType->FirstIndexLocation,
             (GLenum *)&FirstIndexByteOffset,&local_28);
  if ((_GLIndexType->NumIndices != 0) && (_GLIndexType->NumInstances != 0)) {
    DrawElements(FirstIndexByteOffset._4_4_,_GLIndexType->NumIndices,(GLenum)FirstIndexByteOffset,
                 _GLIndexType->NumInstances,local_28,_GLIndexType->BaseVertex,
                 _GLIndexType->FirstInstanceLocation);
  }
  PostDraw(this);
  return;
}

Assistant:

void DeviceContextGLImpl::DrawIndexed(const DrawIndexedAttribs& Attribs)
{
    TDeviceContextBase::DrawIndexed(Attribs, 0);

    GLenum GlTopology;
    PrepareForDraw(Attribs.Flags, true, GlTopology);
    GLenum GLIndexType;
    size_t FirstIndexByteOffset;
    PrepareForIndexedDraw(Attribs.IndexType, Attribs.FirstIndexLocation, GLIndexType, FirstIndexByteOffset);

    // NOTE: Base Vertex and Base Instance versions are not supported even in OpenGL ES 3.1
    // This functionality can be emulated by adjusting stream offsets. This, however may cause
    // errors in case instance data is read from the same stream as vertex data. Thus handling
    // such cases is left to the application

    if (Attribs.NumIndices > 0 && Attribs.NumInstances > 0)
    {
        DrawElements(GlTopology,
                     Attribs.NumIndices,
                     GLIndexType,
                     Attribs.NumInstances,
                     FirstIndexByteOffset,
                     Attribs.BaseVertex,
                     Attribs.FirstInstanceLocation);
    }

    PostDraw();
}